

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

ClauseHead * Clasp::ClauseCreator::newProblemClause(Solver *s,ClauseRep *clause,uint32 flags)

{
  bool bVar1;
  SharedContext *this;
  uint in_EDX;
  ConstraintInfo *in_RSI;
  Solver *in_RDI;
  uint32 cwp;
  uint32 p;
  uint32 i;
  uint32 cw2;
  uint32 cw1;
  uint32 sw;
  uint32 fw;
  WatchInitMode wMode;
  ClauseHead *ret;
  Constraint *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  ClauseRep *in_stack_ffffffffffffff88;
  Solver *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined1 uVar2;
  Solver *pSVar3;
  uint32 local_48;
  uint local_44;
  uint local_40;
  uint32 local_3c;
  uint32 local_38;
  uint32 local_34;
  uint32 local_30;
  uint local_2c;
  uint local_28;
  WatchInitMode local_24;
  ClauseHead *local_20;
  uint local_14;
  ConstraintInfo *local_10;
  Solver *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_24 = Solver::watchInitMode(in_RDI);
  if ((local_14 & 0x400) == 0) {
    if ((local_14 & 0x800) == 0) {
      if ((local_14 & 0x1000) != 0) {
        local_24 = watch_least;
      }
    }
    else {
      local_24 = watch_rand;
    }
  }
  else {
    local_24 = watch_first;
  }
  if ((2 < (local_10[1].super_ConstraintScore.rep & 0x7fffffff)) && (local_24 != watch_first)) {
    local_28 = 0;
    local_2c = 1;
    if (local_24 == watch_rand) {
      local_28 = RNG::irand((RNG *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      do {
        local_2c = RNG::irand((RNG *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      } while (local_2c == local_28);
    }
    else if (local_24 == watch_least) {
      pSVar3 = local_8;
      local_34 = (uint32)Literal::operator~((Literal *)in_stack_ffffffffffffff78);
      local_30 = Solver::numWatches((Solver *)
                                    CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                                    (Literal)(uint32)pSVar3);
      local_3c = (uint32)Literal::operator~((Literal *)in_stack_ffffffffffffff78);
      local_38 = Solver::numWatches((Solver *)
                                    CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                                    (Literal)(uint32)pSVar3);
      if (local_38 < local_30) {
        std::swap<unsigned_int>(&local_28,&local_2c);
        std::swap<unsigned_int>(&local_30,&local_38);
      }
      for (local_40 = 2; bVar1 = local_40 != (local_10[1].super_ConstraintScore.rep & 0x7fffffff),
          uVar2 = bVar1 && local_38 != 0, bVar1 && local_38 != 0; local_40 = local_40 + 1) {
        local_44 = local_40;
        in_stack_ffffffffffffff90 = local_8;
        Literal::operator~((Literal *)in_stack_ffffffffffffff78);
        local_48 = Solver::numWatches((Solver *)CONCAT17(uVar2,in_stack_ffffffffffffff98),
                                      (Literal)(uint32)pSVar3);
        if (local_48 < local_30) {
          std::swap<unsigned_int>(&local_48,&local_30);
          std::swap<unsigned_int>(&local_28,&local_44);
        }
        if (local_48 < local_38) {
          std::swap<unsigned_int>(&local_48,&local_38);
          std::swap<unsigned_int>(&local_2c,&local_44);
        }
      }
    }
    std::swap<Clasp::Literal>
              (*(Literal **)(local_10 + 2),
               (Literal *)(*(long *)(local_10 + 2) + (ulong)local_28 * 4));
    std::swap<Clasp::Literal>
              ((Literal *)(*(long *)(local_10 + 2) + 4),
               (Literal *)(*(long *)(local_10 + 2) + (ulong)local_2c * 4));
  }
  if (5 < (local_10[1].super_ConstraintScore.rep & 0x7fffffff)) {
    this = Solver::sharedContext(local_8);
    bVar1 = SharedContext::physicalShareProblem(this);
    if (bVar1) {
      in_stack_ffffffffffffff78 = *(Constraint **)(local_10 + 2);
      in_stack_ffffffffffffff84 = local_10[1].super_ConstraintScore.rep & 0x7fffffff;
      ConstraintInfo::type(local_10);
      SharedLiterals::newShareable
                ((Literal *)in_stack_ffffffffffffff90,(uint32)((ulong)local_8 >> 0x20),
                 (ConstraintType)local_8,in_stack_ffffffffffffff84);
      local_20 = Clause::newShared(in_stack_ffffffffffffff90,(SharedLiterals *)local_8,
                                   (InfoType *)
                                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                   (Literal *)in_stack_ffffffffffffff78,false);
      goto LAB_0022b1e0;
    }
  }
  local_20 = Clause::newClause(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
LAB_0022b1e0:
  if ((local_14 & 1) == 0) {
    Solver::add((Solver *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                in_stack_ffffffffffffff78);
  }
  return local_20;
}

Assistant:

ClauseHead* ClauseCreator::newProblemClause(Solver& s, const ClauseRep& clause, uint32 flags) {
	ClauseHead* ret;
	Solver::WatchInitMode wMode = s.watchInitMode();
	if      (flags&clause_watch_first){ wMode = SolverStrategies::watch_first;}
	else if (flags&clause_watch_rand) { wMode = SolverStrategies::watch_rand; }
	else if (flags&clause_watch_least){ wMode = SolverStrategies::watch_least;}
	if (clause.size > 2 && wMode != SolverStrategies::watch_first) {
		uint32 fw = 0, sw = 1;
		if (wMode == SolverStrategies::watch_rand) {
			fw = s.rng.irand(clause.size);
			do { sw = s.rng.irand(clause.size); } while (sw == fw);
		}
		else if (wMode == SolverStrategies::watch_least) {
			uint32 cw1 = s.numWatches(~clause.lits[0]);
			uint32 cw2 = s.numWatches(~clause.lits[1]);
			if (cw1 > cw2) { std::swap(fw, sw); std::swap(cw1, cw2); }
			for (uint32 i = 2; i != clause.size && cw2; ++i) {
				uint32 p   = i;
				uint32 cwp = s.numWatches(~clause.lits[i]);
				if (cwp < cw1) { std::swap(cwp, cw1); std::swap(fw, p); }
				if (cwp < cw2) { std::swap(cwp, cw2); std::swap(sw, p); }
			}
		}
		std::swap(clause.lits[0], clause.lits[fw]);
		std::swap(clause.lits[1], clause.lits[sw]);
	}
	if (clause.size <= Clause::MAX_SHORT_LEN || !s.sharedContext()->physicalShareProblem()) {
		ret = Clause::newClause(s, clause);
	}
	else {
		ret = Clause::newShared(s, SharedLiterals::newShareable(clause.lits, clause.size, clause.info.type(), 1), clause.info, clause.lits, false);
	}
	if ( (flags & clause_no_add) == 0 ) {
		assert(!clause.info.aux());
		s.add(ret);
	}
	return ret;
}